

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSat.c
# Opt level: O2

int Fra_NodesAreEquiv(Fra_Man_t *p,Aig_Obj_t *pOld,Aig_Obj_t *pNew)

{
  int *piVar1;
  Fra_Par_t *pFVar2;
  int iVar3;
  sat_solver *psVar4;
  abctime aVar5;
  abctime aVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  char *__assertion;
  long lVar10;
  double dVar11;
  undefined8 local_48;
  lit local_40 [4];
  
  if (((ulong)pNew & 1) != 0) {
    __assertion = "!Aig_IsComplement(pNew)";
    uVar9 = 0x37;
LAB_00558886:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSat.c"
                  ,uVar9,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (((ulong)pOld & 1) != 0) {
    __assertion = "!Aig_IsComplement(pOld)";
    uVar9 = 0x38;
    goto LAB_00558886;
  }
  if (pNew == pOld) {
    __assertion = "pNew != pOld";
    uVar9 = 0x39;
    goto LAB_00558886;
  }
  pFVar2 = p->pPars;
  uVar9 = pFVar2->nBTLimitNode;
  if (((pFVar2->fSpeculate == 0) && (0 < (int)uVar9 && pFVar2->nFramesK == 0)) &&
     (((pOld->field_0x18 & 0x20) != 0 || ((pNew->field_0x18 & 0x20) != 0)))) {
    p->nSatFails = p->nSatFails + 1;
    if (uVar9 < 0xb) {
      return -1;
    }
    dVar11 = pow((double)(int)uVar9,0.7);
    uVar9 = (uint)dVar11;
  }
  p->nSatCalls = p->nSatCalls + 1;
  p->nSatCallsRecent = p->nSatCallsRecent + 1;
  if (p->pSat == (sat_solver *)0x0) {
    psVar4 = sat_solver_new();
    p->pSat = psVar4;
    p->nSatVars = 1;
    sat_solver_setnvars(psVar4,1000);
    local_48 = (ulong)local_48._4_4_ << 0x20;
    sat_solver_addclause(p->pSat,(lit *)&local_48,(lit *)((long)&local_48 + 4));
  }
  Fra_CnfNodeAddToSolver(p,pOld,pNew);
  psVar4 = p->pSat;
  if (psVar4->qtail != psVar4->qhead) {
    iVar3 = sat_solver_simplify(psVar4);
    if (iVar3 == 0) {
      __assertion = "status != 0";
      uVar9 = 0x5d;
      goto LAB_00558886;
    }
    if (p->pSat->qtail != p->pSat->qhead) {
      __assertion = "p->pSat->qtail == p->pSat->qhead";
      uVar9 = 0x5e;
      goto LAB_00558886;
    }
  }
  if (p->pPars->fConeBias != 0) {
    Fra_SetActivityFactors(p,pOld,pNew);
  }
  aVar5 = Abc_Clock();
  local_48 = CONCAT44((uint)(((*(uint *)&pNew->field_0x18 ^ *(uint *)&pOld->field_0x18) & 8) == 0) +
                      *(int *)(*(long *)((long)(pNew->field_5).pData + 0x98) + (long)pNew->Id * 4) *
                      2,*(int *)(*(long *)((long)(pOld->field_5).pData + 0x98) + (long)pOld->Id * 4)
                        * 2);
  iVar3 = sat_solver_solve(p->pSat,(lit *)&local_48,local_40,(long)(int)uVar9,0,p->nBTLimitGlobal,
                           p->nInsLimitGlobal);
  aVar6 = Abc_Clock();
  p->timeSat = p->timeSat + (aVar6 - aVar5);
  aVar6 = Abc_Clock();
  lVar7 = aVar6 - aVar5;
  if (iVar3 != 1) {
    iVar8 = -1;
    if (iVar3 != -1) {
      p->timeSatFail = p->timeSatFail + lVar7;
      if (p->pManFraig->pConst1 != pOld) {
        pOld->field_0x18 = pOld->field_0x18 | 0x20;
      }
      pNew->field_0x18 = pNew->field_0x18 | 0x20;
      lVar10 = 0xe4;
      goto LAB_005587dd;
    }
    p->timeSatUnsat = p->timeSatUnsat + lVar7;
    local_48 = local_48 ^ 0x100000001;
    iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_48,local_40);
    if (iVar3 == 0) {
      __assertion = "RetValue";
      uVar9 = 0x75;
      goto LAB_00558886;
    }
    p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
    iVar8 = 1;
    lVar10 = 0xdc;
    if (p->pManFraig->pConst1 == pOld) goto LAB_005587dd;
    aVar5 = Abc_Clock();
    local_48 = CONCAT44(((*(uint *)&pNew->field_0x18 ^ *(uint *)&pOld->field_0x18) >> 3 & 1) +
                        *(int *)(*(long *)((long)(pNew->field_5).pData + 0x98) + (long)pNew->Id * 4)
                        * 2,*(int *)(*(long *)((long)(pOld->field_5).pData + 0x98) +
                                    (long)pOld->Id * 4) * 2 + 1);
    iVar3 = sat_solver_solve(p->pSat,(lit *)&local_48,local_40,(long)(int)uVar9,0,p->nBTLimitGlobal,
                             p->nInsLimitGlobal);
    aVar6 = Abc_Clock();
    p->timeSat = p->timeSat + (aVar6 - aVar5);
    aVar6 = Abc_Clock();
    lVar7 = aVar6 - aVar5;
    if (iVar3 != 1) {
      if (iVar3 == -1) {
        p->timeSatUnsat = p->timeSatUnsat + lVar7;
        local_48 = local_48 ^ 0x100000001;
        iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_48,local_40);
        if (iVar3 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSat.c"
                        ,0xa1,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
        }
        p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
        iVar8 = 1;
      }
      else {
        p->timeSatFail = p->timeSatFail + lVar7;
        pOld->field_0x18 = pOld->field_0x18 | 0x20;
        pNew->field_0x18 = pNew->field_0x18 | 0x20;
        lVar10 = 0xe4;
        iVar8 = -1;
      }
      goto LAB_005587dd;
    }
  }
  p->timeSatSat = p->timeSatSat + lVar7;
  Fra_SmlSavePattern(p);
  lVar10 = 0xd4;
  iVar8 = 0;
LAB_005587dd:
  piVar1 = (int *)((long)&p->pPars + lVar10);
  *piVar1 = *piVar1 + 1;
  return iVar8;
}

Assistant:

int Fra_NodesAreEquiv( Fra_Man_t * p, Aig_Obj_t * pOld, Aig_Obj_t * pNew )
{
    int pLits[4], RetValue, RetValue1, nBTLimit;
    abctime clk;//, clk2 = Abc_Clock();
    int status;

    // make sure the nodes are not complemented
    assert( !Aig_IsComplement(pNew) );
    assert( !Aig_IsComplement(pOld) );
    assert( pNew != pOld );

    // if at least one of the nodes is a failed node, perform adjustments:
    // if the backtrack limit is small, simply skip this node
    // if the backtrack limit is > 10, take the quare root of the limit
    nBTLimit = p->pPars->nBTLimitNode;
    if ( !p->pPars->fSpeculate && p->pPars->nFramesK == 0 && (nBTLimit > 0 && (pOld->fMarkB || pNew->fMarkB)) )
    {
        p->nSatFails++;
        // fail immediately
//        return -1;
        if ( nBTLimit <= 10 )
            return -1;
        nBTLimit = (int)pow(nBTLimit, 0.7);
    }

    p->nSatCalls++;
    p->nSatCallsRecent++;

    // make sure the solver is allocated and has enough variables
    if ( p->pSat == NULL )
    {
        p->pSat = sat_solver_new();
        p->nSatVars = 1;
        sat_solver_setnvars( p->pSat, 1000 );
        // var 0 is reserved for const1 node - add the clause
        pLits[0] = toLit( 0 );
        sat_solver_addclause( p->pSat, pLits, pLits + 1 );
    }

    // if the nodes do not have SAT variables, allocate them
    Fra_CnfNodeAddToSolver( p, pOld, pNew );

    if ( p->pSat->qtail != p->pSat->qhead )
    {
        status = sat_solver_simplify(p->pSat);
        assert( status != 0 );
        assert( p->pSat->qtail == p->pSat->qhead );
    }

    // prepare variable activity
    if ( p->pPars->fConeBias )
        Fra_SetActivityFactors( p, pOld, pNew ); 

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
clk = Abc_Clock();
    pLits[0] = toLitCond( Fra_ObjSatNum(pOld), 0 );
    pLits[1] = toLitCond( Fra_ObjSatNum(pNew), pOld->fPhase == pNew->fPhase );
//Sat_SolverWriteDimacs( p->pSat, "temp.cnf", pLits, pLits + 2, 1 );
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, 
        p->nBTLimitGlobal, p->nInsLimitGlobal );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        // continue solving the other implication
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        Fra_SmlSavePattern( p );
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatFail += Abc_Clock() - clk;
        // mark the node as the failed node
        if ( pOld != p->pManFraig->pConst1 ) 
            pOld->fMarkB = 1;
        pNew->fMarkB = 1;
        p->nSatFailsReal++;
        return -1;
    }

    // if the old node was constant 0, we already know the answer
    if ( pOld == p->pManFraig->pConst1 )
    {
        p->nSatProof++;
        return 1;
    }

    // solve under assumptions
    // A = 0; B = 1     OR     A = 0; B = 0 
clk = Abc_Clock();
    pLits[0] = toLitCond( Fra_ObjSatNum(pOld), 1 );
    pLits[1] = toLitCond( Fra_ObjSatNum(pNew), pOld->fPhase ^ pNew->fPhase );
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, 
        p->nBTLimitGlobal, p->nInsLimitGlobal );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        Fra_SmlSavePattern( p );
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatFail += Abc_Clock() - clk;
        // mark the node as the failed node
        pOld->fMarkB = 1;
        pNew->fMarkB = 1;
        p->nSatFailsReal++;
        return -1;
    }
/*
    // check BDD proof
    {
        int RetVal;
        ABC_PRT( "Sat", Abc_Clock() - clk2 );
        clk2 = Abc_Clock();
        RetVal = Fra_NodesAreEquivBdd( pOld, pNew );
//        printf( "%d ", RetVal );
        assert( RetVal );
        ABC_PRT( "Bdd", Abc_Clock() - clk2 );
        printf( "\n" );
    }
*/
    // return SAT proof
    p->nSatProof++;
    return 1;
}